

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar3;
  float logMax;
  int i_1;
  int offset_1;
  int l_1;
  float oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  float max;
  int k;
  int endPattern;
  int startPattern;
  int local_58;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  float local_38;
  int local_34;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 0x88) + (long)(in_R9D + 1) * 4);
  for (local_34 = *(int *)(*(long *)(in_RDI + 0x88) + (long)in_R9D * 4); local_34 < iVar1;
      local_34 = local_34 + 1) {
    local_38 = 0.0;
    iVar2 = local_34 * *(int *)(in_RDI + 0x2c);
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x34); local_40 = local_40 + 1) {
      local_44 = local_40 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar2;
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x24); local_48 = local_48 + 1) {
        if (local_38 < *(float *)(in_RSI + (long)local_44 * 4)) {
          local_38 = *(float *)(in_RSI + (long)local_44 * 4);
        }
        local_44 = local_44 + 1;
      }
    }
    if ((local_38 == 0.0) && (!NAN(local_38))) {
      local_38 = 1.0;
    }
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x34); local_50 = local_50 + 1) {
      local_54 = local_50 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar2;
      for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x24); local_58 = local_58 + 1) {
        *(float *)(in_RSI + (long)local_54 * 4) =
             (1.0 / local_38) * *(float *)(in_RSI + (long)local_54 * 4);
        local_54 = local_54 + 1;
      }
    }
    if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
      *(float *)(in_RDX + (long)local_34 * 4) = local_38;
      if (in_RCX != 0) {
        dVar3 = log((double)local_38);
        *(float *)(in_RCX + (long)local_34 * 4) =
             (float)((double)*(float *)(in_RCX + (long)local_34 * 4) + dVar3);
      }
    }
    else {
      dVar3 = log((double)local_38);
      *(float *)(in_RDX + (long)local_34 * 4) = (float)dVar3;
      if (in_RCX != 0) {
        *(float *)(in_RCX + (long)local_34 * 4) =
             (float)dVar3 + *(float *)(in_RCX + (long)local_34 * 4);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}